

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLexer.h
# Opt level: O2

void __thiscall LStringLexer::~LStringLexer(LStringLexer *this)

{
  ~LStringLexer(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~LStringLexer() override = default;